

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::search_declare_loss(search_private *priv,float loss)

{
  SearchState SVar1;
  float loss_local;
  search_private *priv_local;
  
  priv->loss_declared_cnt = priv->loss_declared_cnt + 1;
  SVar1 = priv->state;
  if (SVar1 == INIT_TEST) {
    priv->test_loss = loss + priv->test_loss;
  }
  else if (SVar1 == INIT_TRAIN) {
    priv->train_loss = loss + priv->train_loss;
  }
  else if ((SVar1 == LEARN) &&
          ((priv->rollout_num_steps == 0 || (priv->loss_declared_cnt <= priv->rollout_num_steps))))
  {
    priv->learn_loss = loss + priv->learn_loss;
  }
  return;
}

Assistant:

void search_declare_loss(search_private& priv, float loss)
{
  priv.loss_declared_cnt++;
  switch (priv.state)
  {
    case INIT_TEST:
      priv.test_loss += loss;
      break;
    case INIT_TRAIN:
      priv.train_loss += loss;
      break;
    case LEARN:
      if ((priv.rollout_num_steps == 0) || (priv.loss_declared_cnt <= priv.rollout_num_steps))
      {
        priv.learn_loss += loss;
        cdbg << "priv.learn_loss += " << loss << " (now = " << priv.learn_loss << ")" << endl;
      }
      break;
    default:
      break;  // get rid of the warning about missing cases (danger!)
  }
}